

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int getpartial(mustach_itf *itf,void *closure,char *name,char **result)

{
  FILE *file_00;
  long in_FS_OFFSET;
  FILE *file;
  int rc;
  char **result_local;
  char *name_local;
  void *closure_local;
  mustach_itf *itf_local;
  size_t size;
  
  size = *(size_t *)(in_FS_OFFSET + 0x28);
  *result = (char *)0x0;
  file_00 = memfile_open(result,(size_t *)&itf_local);
  if (file_00 == (FILE *)0x0) {
    file._4_4_ = -1;
  }
  else {
    file._4_4_ = (*itf->put)(closure,name,0,file_00);
    if (file._4_4_ < 0) {
      memfile_abort(file_00,result,(size_t *)&itf_local);
    }
    else {
      file._4_4_ = memfile_close(file_00,result,(size_t *)&itf_local);
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != size) {
    __stack_chk_fail();
  }
  return file._4_4_;
}

Assistant:

static int getpartial(struct mustach_itf *itf, void *closure, const char *name, char **result)
{
	int rc;
	FILE *file;
	size_t size;

	*result = NULL;
	file = memfile_open(result, &size);
	if (file == NULL)
		rc = MUSTACH_ERROR_SYSTEM;
	else {
		rc = itf->put(closure, name, 0, file);
		if (rc < 0)
			memfile_abort(file, result, &size);
		else
			rc = memfile_close(file, result, &size);
	}
	return rc;
}